

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.hh
# Opt level: O0

void __thiscall Parsing::MalformedXML::MalformedXML(MalformedXML *this,string *file)

{
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *file_local;
  MalformedXML *this_local;
  
  local_18 = file;
  file_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"malformed XML",&local_39);
  Typelib::ImportError::ImportError(&this->super_ImportError,(string *)file,local_38,0,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *(undefined ***)this = &PTR__MalformedXML_00122810;
  return;
}

Assistant:

MalformedXML(const std::string& file = "")
            : ImportError(file, "malformed XML") {}